

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorClassifier::set_allocated_sparsesupportvectors
          (SupportVectorClassifier *this,SparseSupportVectors *sparsesupportvectors)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  SparseSupportVectors *sparsesupportvectors_local;
  SupportVectorClassifier *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_supportVectors(this);
  if (sparsesupportvectors != (SparseSupportVectors *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<CoreML::Specification::SparseSupportVectors>::
         GetOwningArena(sparsesupportvectors);
    message_arena = (Arena *)sparsesupportvectors;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::SparseSupportVectors>
                              (message_arena_00,sparsesupportvectors,submessage_arena_00);
    }
    set_has_sparsesupportvectors(this);
    (this->supportVectors_).sparsesupportvectors_ = (SparseSupportVectors *)message_arena;
  }
  return;
}

Assistant:

void SupportVectorClassifier::set_allocated_sparsesupportvectors(::CoreML::Specification::SparseSupportVectors* sparsesupportvectors) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_supportVectors();
  if (sparsesupportvectors) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::SparseSupportVectors>::GetOwningArena(sparsesupportvectors);
    if (message_arena != submessage_arena) {
      sparsesupportvectors = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, sparsesupportvectors, submessage_arena);
    }
    set_has_sparsesupportvectors();
    supportVectors_.sparsesupportvectors_ = sparsesupportvectors;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.SupportVectorClassifier.sparseSupportVectors)
}